

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roots.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
opengv::math::o3_roots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *p)

{
  undefined1 auVar1 [16];
  double *pdVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  ulong extraout_XMM0_Qb;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double theta_0;
  complex<double> local_b8;
  double local_a8;
  double dStack_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  complex<double> local_68;
  complex<double> local_58;
  complex<double> local_48;
  
  pdVar2 = (p->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  dVar5 = *pdVar2;
  dVar6 = pdVar2[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar6;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar5 * -3.0 * pdVar2[2];
  auVar4 = vfmadd231sd_fma(auVar20,auVar16,auVar16);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = pdVar2[2] * dVar6 * dVar5 * -9.0;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar6 * (dVar6 + dVar6);
  auVar13 = vfmadd231sd_fma(auVar19,auVar16,auVar21);
  local_70 = auVar4._0_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = pdVar2[3];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar5 * dVar5 * 27.0;
  auVar4 = vfmadd132sd_fma(auVar22,auVar13,auVar4);
  local_a8 = 0.0;
  dStack_a0 = 0.0;
  local_48._M_value._0_8_ = 0x3ff0000000000000;
  local_48._M_value._8_8_ = 0;
  local_58._M_value._0_8_ = 0xbfe0000000000000;
  local_58._M_value._8_8_ = 0x3febb67ae8584caa;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_70 * local_70 * local_70 * -4.0;
  auVar13 = vfmadd231sd_fma(auVar13,auVar4,auVar4);
  local_68._M_value._0_8_ = 0xbfe0000000000000;
  local_68._M_value._8_8_ = 0xbfebb67ae8584caa;
  dVar5 = auVar13._0_8_;
  if (0.0 <= dVar5) {
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      auVar13 = vsqrtsd_avx(auVar13,auVar13);
      dVar5 = auVar13._0_8_;
    }
    dVar5 = (auVar4._0_8_ + dVar5) * 0.5;
    if (0.0 <= dVar5) {
      local_a8 = pow(dVar5,0.3333333333333333);
    }
    else {
      dVar5 = pow(-dVar5,0.3333333333333333);
      auVar14._0_8_ = -dVar5;
      auVar14._8_8_ = extraout_XMM0_Qb ^ 0x8000000000000000;
      local_a8 = (double)vmovlpd_avx(auVar14);
    }
    dStack_a0 = 0.0;
  }
  else {
    dVar6 = auVar4._0_8_ * 0.5;
    auVar17._0_8_ = -dVar5;
    auVar17._8_8_ = auVar13._8_8_ ^ 0x8000000000000000;
    if (-0.0 < dVar5) {
      dVar5 = sqrt(auVar17._0_8_);
    }
    else {
      auVar4 = vsqrtsd_avx(auVar17,auVar17);
      dVar5 = auVar4._0_8_;
    }
    dVar5 = dVar5 * 0.5;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar6 * dVar6 + dVar5 * dVar5;
    auVar4 = vsqrtsd_avx(auVar18,auVar18);
    dVar5 = atan(dVar5 / dVar6);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dVar6;
    uVar15 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar1,0xe);
    bVar3 = (bool)((byte)uVar15 & 1);
    dVar6 = pow(auVar4._0_8_,0.3333333333333333);
    dVar5 = (double)((ulong)bVar3 * (long)(dVar5 + 3.141592653589793) + (ulong)!bVar3 * (long)dVar5)
            / 3.0;
    dVar7 = cos(dVar5);
    dStack_a0 = sin(dVar5);
    dStack_a0 = dStack_a0 * dVar6;
    local_a8 = dVar7 * dVar6;
  }
  uVar15 = 0xbff0000000000000;
  dVar8 = -1.0 / (*pdVar2 * 3.0);
  dVar9 = dVar8;
  std::operator*(&local_48,(complex<double> *)&local_a8);
  dVar5 = pdVar2[1];
  dVar10 = dVar9 + dVar5;
  std::operator*(&local_48,(complex<double> *)&local_a8);
  local_b8._M_value._0_8_ = dVar10;
  local_b8._M_value._8_8_ = uVar15;
  std::operator/(&local_70,&local_b8);
  dVar6 = *pdVar2;
  dVar11 = dVar6;
  std::operator*(&local_58,(complex<double> *)&local_a8);
  dVar7 = pdVar2[1];
  local_78 = dVar7;
  std::operator*(&local_58,(complex<double> *)&local_a8);
  local_b8._M_value._0_8_ = dVar7;
  local_b8._M_value._8_8_ = uVar15;
  std::operator/(&local_70,&local_b8);
  dVar12 = *pdVar2 * 3.0;
  local_88 = dVar12;
  local_80 = dVar7;
  std::operator*(&local_68,(complex<double> *)&local_a8);
  dVar12 = dVar12 + pdVar2[1];
  local_90 = dVar12;
  std::operator*(&local_68,(complex<double> *)&local_a8);
  local_b8._M_value._0_8_ = dVar12;
  local_b8._M_value._8_8_ = uVar15;
  std::operator/(&local_70,&local_b8);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_value._0_8_ = (dVar10 + dVar9 + dVar5) * dVar8;
  local_98 = dVar12;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (__return_storage_ptr__,(double *)&local_b8);
  local_b8._M_value._0_8_ = (-1.0 / (dVar6 * 3.0)) * (local_78 + dVar11 + local_80);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (__return_storage_ptr__,(double *)&local_b8);
  local_b8._M_value._0_8_ = (-1.0 / local_88) * (local_98 + local_90);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (__return_storage_ptr__,(double *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double>
opengv::math::o3_roots( const std::vector<double> & p )
{
  const double & a = p[0];
  const double & b = p[1];
  const double & c = p[2];
  const double & d = p[3];
  
  double theta_0 = b*b - 3.0*a*c;
  double theta_1 = 2.0*b*b*b - 9.0*a*b*c + 27.0*a*a*d;
  double term = theta_1 * theta_1 - 4.0 * theta_0 * theta_0 * theta_0;
  
  std::complex<double> u1( 1.0, 0.0);
  std::complex<double> u2(-0.5, 0.5*sqrt(3.0));
  std::complex<double> u3(-0.5,-0.5*sqrt(3.0));
  std::complex<double> C;
  
  if( term >= 0.0 )
  {
    double C3 = 0.5 * (theta_1 + sqrt(term));
    
    if( C3 < 0.0 )
      C = std::complex<double>(-pow(-C3,(1.0/3.0)),0.0);
    else
      C = std::complex<double>( pow( C3,(1.0/3.0)),0.0);
  }
  else
  {
    std::complex<double> C3( 0.5*theta_1, 0.5*sqrt(-term) );
    
    //take the third root of this complex number
    double r3 = sqrt(pow(C3.real(),2.0)+pow(C3.imag(),2.0));
    double a3 = atan(C3.imag() / C3.real());
    if( C3.real() < 0 )
      a3 += M_PI;
    
    double r = pow(r3,(1.0/3.0));
    C = std::complex<double>(r*cos(a3/3.0),r*sin(a3/3.0));
  }
  
  std::complex<double> r1 = -(1.0/(3.0*a)) * (b + u1*C + theta_0 / (u1*C) );
  std::complex<double> r2 = -(1.0/(3.0*a)) * (b + u2*C + theta_0 / (u2*C) );
  std::complex<double> r3 = -(1.0/(3.0*a)) * (b + u3*C + theta_0 / (u3*C) );
  
  std::vector<double> roots;
  roots.push_back(r1.real());
  roots.push_back(r2.real());
  roots.push_back(r3.real());
  return roots;
}